

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O1

void __thiscall
vkt::ubo::anon_unknown_0::BlockSingleStructArrayCase::BlockSingleStructArrayCase
          (BlockSingleStructArrayCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  ShaderInterface *this_00;
  vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  StructType *this_02;
  UniformBlock *pUVar3;
  string local_c8;
  Uniform local_a8;
  VarType local_68;
  BlockSingleStructArrayCase *local_50;
  VarType local_48;
  
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00d28e50;
  paVar1 = &local_a8.m_name.field_2;
  local_a8.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_50 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"S","");
  this_00 = &(this->super_UniformBlockCase).m_interface;
  this_02 = ShaderInterface::allocStruct(this_00,&local_a8.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_name._M_dataplus._M_p,
                    local_a8.m_name.field_2._M_allocated_capacity + 1);
  }
  local_a8.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"a","");
  VarType::VarType((VarType *)&local_c8,TYPE_INT_VEC3,4);
  StructType::addMember(this_02,&local_a8.m_name,(VarType *)&local_c8,0x1800);
  VarType::~VarType((VarType *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_name._M_dataplus._M_p,
                    local_a8.m_name.field_2._M_allocated_capacity + 1);
  }
  local_a8.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"b","");
  VarType::VarType(&local_68,TYPE_FLOAT_MAT3,2);
  VarType::VarType((VarType *)&local_c8,&local_68,4);
  StructType::addMember(this_02,&local_a8.m_name,(VarType *)&local_c8,0);
  VarType::~VarType((VarType *)&local_c8);
  VarType::~VarType(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_name._M_dataplus._M_p,
                    local_a8.m_name.field_2._M_allocated_capacity + 1);
  }
  local_a8.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"c","");
  VarType::VarType((VarType *)&local_c8,TYPE_FLOAT_VEC4,4);
  StructType::addMember(this_02,&local_a8.m_name,(VarType *)&local_c8,0);
  VarType::~VarType((VarType *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_name._M_dataplus._M_p,
                    local_a8.m_name.field_2._M_allocated_capacity + 1);
  }
  local_a8.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Block","");
  pUVar3 = ShaderInterface::allocBlock(this_00,&local_a8.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_name._M_dataplus._M_p,
                    local_a8.m_name.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"u","");
  VarType::VarType(&local_68,TYPE_UINT,1);
  Uniform::Uniform(&local_a8,&local_c8,&local_68,0);
  this_01 = &pUVar3->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_a8);
  VarType::~VarType(&local_a8.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_name._M_dataplus._M_p,
                    local_a8.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"s","");
  VarType::VarType(&local_48,this_02,0);
  VarType::VarType(&local_68,&local_48,3);
  Uniform::Uniform(&local_a8,&local_c8,&local_68,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_a8);
  VarType::~VarType(&local_a8.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_name._M_dataplus._M_p,
                    local_a8.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_68);
  VarType::~VarType(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"v","");
  VarType::VarType(&local_68,TYPE_FLOAT_VEC4,2);
  Uniform::Uniform(&local_a8,&local_c8,&local_68,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_a8);
  VarType::~VarType(&local_a8.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.m_name._M_dataplus._M_p,
                    local_a8.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pUVar3->m_flags = layoutFlags;
  if (0 < numInstances) {
    local_a8.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"block","");
    std::__cxx11::string::_M_assign((string *)&pUVar3->m_instanceName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.m_name._M_dataplus._M_p,
                      local_a8.m_name.field_2._M_allocated_capacity + 1);
    }
    pUVar3->m_arraySize = numInstances;
  }
  (*(local_50->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [2])();
  return;
}

Assistant:

BlockSingleStructArrayCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH), UNUSED_BOTH);
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_LOW)));
		block.addUniform(Uniform("s", VarType(VarType(&typeS), 3)));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_MEDIUM)));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(numInstances);
		}

		init();
	}